

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O1

void key_callback(GLFWwindow *window,wchar_t key,wchar_t scancode,wchar_t action,wchar_t mods)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  char *local_38;
  
  uVar2 = counter;
  if (key < L'Ā') {
    switch(key) {
    case L'\0':
    case L'\x01':
    case L'\x02':
    case L'\x03':
    case L'\x04':
    case L'\x05':
    case L'\x06':
    case L'\a':
    case L'\b':
    case L'\t':
    case L'\n':
    case L'\v':
    case L'\f':
    case L'\r':
    case L'\x0e':
    case L'\x0f':
    case L'\x10':
    case L'\x11':
    case L'\x12':
    case L'\x13':
    case L'\x14':
    case L'\x15':
    case L'\x16':
    case L'\x17':
    case L'\x18':
    case L'\x19':
    case L'\x1a':
    case L'\x1b':
    case L'\x1c':
    case L'\x1d':
    case L'\x1e':
    case L'\x1f':
    case L'!':
    case L'\"':
    case L'#':
    case L'$':
    case L'%':
    case L'&':
    case L'(':
    case L')':
    case L'*':
    case L'+':
    case L':':
    case L'<':
    case L'>':
    case L'?':
    case L'@':
    case L'^':
    case L'_':
      goto switchD_001071bc_caseD_10e;
    case L' ':
      local_38 = "SPACE";
      break;
    case L'\'':
      local_38 = "APOSTROPHE";
      break;
    case L',':
      local_38 = "COMMA";
      break;
    case L'-':
      local_38 = "MINUS";
      break;
    case L'.':
      local_38 = "PERIOD";
      break;
    case L'/':
      local_38 = "SLASH";
      break;
    case L'0':
      local_38 = "0";
      break;
    case L'1':
      local_38 = "1";
      break;
    case L'2':
      local_38 = "2";
      break;
    case L'3':
      local_38 = "3";
      break;
    case L'4':
      local_38 = "4";
      break;
    case L'5':
      local_38 = "5";
      break;
    case L'6':
      local_38 = "6";
      break;
    case L'7':
      local_38 = "7";
      break;
    case L'8':
      local_38 = "8";
      break;
    case L'9':
      local_38 = "9";
      break;
    case L';':
      local_38 = "SEMICOLON";
      break;
    case L'=':
      local_38 = "EQUAL";
      break;
    case L'A':
      local_38 = "A";
      break;
    case L'B':
      local_38 = "B";
      break;
    case L'C':
      local_38 = "C";
      break;
    case L'D':
      local_38 = "D";
      break;
    case L'E':
      local_38 = "E";
      break;
    case L'F':
      local_38 = "F";
      break;
    case L'G':
      local_38 = "G";
      break;
    case L'H':
      local_38 = "H";
      break;
    case L'I':
      local_38 = "I";
      break;
    case L'J':
      local_38 = "J";
      break;
    case L'K':
      local_38 = "K";
      break;
    case L'L':
      local_38 = "L";
      break;
    case L'M':
      local_38 = "M";
      break;
    case L'N':
      local_38 = "N";
      break;
    case L'O':
      local_38 = "O";
      break;
    case L'P':
      local_38 = "P";
      break;
    case L'Q':
      local_38 = "Q";
      break;
    case L'R':
      local_38 = "R";
      break;
    case L'S':
      local_38 = "S";
      break;
    case L'T':
      local_38 = "T";
      break;
    case L'U':
      local_38 = "U";
      break;
    case L'V':
      local_38 = "V";
      break;
    case L'W':
      local_38 = "W";
      break;
    case L'X':
      local_38 = "X";
      break;
    case L'Y':
      local_38 = "Y";
      break;
    case L'Z':
      local_38 = "Z";
      break;
    case L'[':
      local_38 = "LEFT BRACKET";
      break;
    case L'\\':
      local_38 = "BACKSLASH";
      break;
    case L']':
      local_38 = "RIGHT BRACKET";
      break;
    case L'`':
      local_38 = "GRAVE ACCENT";
      break;
    case L'\xffffffff':
      local_38 = "UNKNOWN";
      break;
    default:
      if (key == L'¡') {
        local_38 = "WORLD 1";
      }
      else {
        if (key != L'¢') goto switchD_001071bc_caseD_10e;
        local_38 = "WORLD 2";
      }
    }
  }
  else {
    switch(key) {
    case L'Ā':
      local_38 = "ESCAPE";
      break;
    case L'ā':
      local_38 = "ENTER";
      break;
    case L'Ă':
      local_38 = "TAB";
      break;
    case L'ă':
      local_38 = "BACKSPACE";
      break;
    case L'Ą':
      local_38 = "INSERT";
      break;
    case L'ą':
      local_38 = "DELETE";
      break;
    case L'Ć':
      local_38 = "RIGHT";
      break;
    case L'ć':
      local_38 = "LEFT";
      break;
    case L'Ĉ':
      local_38 = "DOWN";
      break;
    case L'ĉ':
      local_38 = "UP";
      break;
    case L'Ċ':
      local_38 = "PAGE UP";
      break;
    case L'ċ':
      local_38 = "PAGE DOWN";
      break;
    case L'Č':
      local_38 = "HOME";
      break;
    case L'č':
      local_38 = "END";
      break;
    default:
switchD_001071bc_caseD_10e:
      bVar1 = true;
      local_38 = (char *)0x0;
      goto LAB_00107788;
    case L'Ę':
      local_38 = "CAPS LOCK";
      break;
    case L'ę':
      local_38 = "SCROLL LOCK";
      break;
    case L'Ě':
      local_38 = "NUM LOCK";
      break;
    case L'ě':
      local_38 = "PRINT SCREEN";
      break;
    case L'Ĝ':
      local_38 = "PAUSE";
      break;
    case L'Ģ':
      local_38 = "F1";
      break;
    case L'ģ':
      local_38 = "F2";
      break;
    case L'Ĥ':
      local_38 = "F3";
      break;
    case L'ĥ':
      local_38 = "F4";
      break;
    case L'Ħ':
      local_38 = "F5";
      break;
    case L'ħ':
      local_38 = "F6";
      break;
    case L'Ĩ':
      local_38 = "F7";
      break;
    case L'ĩ':
      local_38 = "F8";
      break;
    case L'Ī':
      local_38 = "F9";
      break;
    case L'ī':
      local_38 = "F10";
      break;
    case L'Ĭ':
      local_38 = "F11";
      break;
    case L'ĭ':
      local_38 = "F12";
      break;
    case L'Į':
      local_38 = "F13";
      break;
    case L'į':
      local_38 = "F14";
      break;
    case L'İ':
      local_38 = "F15";
      break;
    case L'ı':
      local_38 = "F16";
      break;
    case L'Ĳ':
      local_38 = "F17";
      break;
    case L'ĳ':
      local_38 = "F18";
      break;
    case L'Ĵ':
      local_38 = "F19";
      break;
    case L'ĵ':
      local_38 = "F20";
      break;
    case L'Ķ':
      local_38 = "F21";
      break;
    case L'ķ':
      local_38 = "F22";
      break;
    case L'ĸ':
      local_38 = "F23";
      break;
    case L'Ĺ':
      local_38 = "F24";
      break;
    case L'ĺ':
      local_38 = "F25";
      break;
    case L'ŀ':
      local_38 = "KEYPAD 0";
      break;
    case L'Ł':
      local_38 = "KEYPAD 1";
      break;
    case L'ł':
      local_38 = "KEYPAD 2";
      break;
    case L'Ń':
      local_38 = "KEYPAD 3";
      break;
    case L'ń':
      local_38 = "KEYPAD 4";
      break;
    case L'Ņ':
      local_38 = "KEYPAD 5";
      break;
    case L'ņ':
      local_38 = "KEYPAD 6";
      break;
    case L'Ň':
      local_38 = "KEYPAD 7";
      break;
    case L'ň':
      local_38 = "KEYPAD 8";
      break;
    case L'ŉ':
      local_38 = "KEYPAD 9";
      break;
    case L'Ŋ':
      local_38 = "KEYPAD DECIMAL";
      break;
    case L'ŋ':
      local_38 = "KEYPAD DIVIDE";
      break;
    case L'Ō':
      local_38 = "KEYPAD MULTPLY";
      break;
    case L'ō':
      local_38 = "KEYPAD SUBTRACT";
      break;
    case L'Ŏ':
      local_38 = "KEYPAD ADD";
      break;
    case L'ŏ':
      local_38 = "KEYPAD ENTER";
      break;
    case L'Ő':
      local_38 = "KEYPAD EQUAL";
      break;
    case L'Ŕ':
      local_38 = "LEFT SHIFT";
      break;
    case L'ŕ':
      local_38 = "LEFT CONTROL";
      break;
    case L'Ŗ':
      local_38 = "LEFT ALT";
      break;
    case L'ŗ':
      local_38 = "LEFT SUPER";
      break;
    case L'Ř':
      local_38 = "RIGHT SHIFT";
      break;
    case L'ř':
      local_38 = "RIGHT CONTROL";
      break;
    case L'Ś':
      local_38 = "RIGHT ALT";
      break;
    case L'ś':
      local_38 = "RIGHT SUPER";
      break;
    case L'Ŝ':
      local_38 = "MENU";
    }
  }
  bVar1 = false;
LAB_00107788:
  counter = counter + 1;
  glfwGetTime();
  printf("%08x at %0.3f: Key 0x%04x Scancode 0x%04x",(ulong)uVar2,(ulong)(uint)key,
         (ulong)(uint)scancode);
  if (!bVar1) {
    printf(" (%s)",local_38);
  }
  if (mods != L'\0') {
    get_mods_name(mods);
    printf(" (with%s)",get_mods_name::name);
  }
  if ((uint)action < 3) {
    pcVar3 = (&PTR_anon_var_dwarf_2f0_00114d20)[(uint)action];
  }
  else {
    pcVar3 = "caused unknown action";
  }
  printf(" was %s\n",pcVar3);
  if (key == L'C' && action == L'\x01') {
    closeable = closeable == '\0';
    pcVar3 = "disabled";
    if ((bool)closeable) {
      pcVar3 = "enabled";
    }
    printf("(( closing %s ))\n",pcVar3);
    return;
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    const char* name = get_key_name(key);

    printf("%08x at %0.3f: Key 0x%04x Scancode 0x%04x",
           counter++, glfwGetTime(), key, scancode);

    if (name)
        printf(" (%s)", name);

    if (mods)
        printf(" (with%s)", get_mods_name(mods));

    printf(" was %s\n", get_action_name(action));

    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_C:
        {
            closeable = !closeable;

            printf("(( closing %s ))\n", closeable ? "enabled" : "disabled");
            break;
        }
    }
}